

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::ImageFeatureType_ImageSize::MergePartialFromCodedStream
          (ImageFeatureType_ImageSize *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  uint64 *puVar7;
  ulong uVar8;
  pair<unsigned_long,_bool> pVar9;
  
  do {
    pbVar4 = input->buffer_;
    uVar2 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar5 = *pbVar4;
      uVar2 = (uint32)bVar5;
      if ((char)bVar5 < '\x01') goto LAB_003b476f;
      input->buffer_ = pbVar4 + 1;
      uVar8 = (ulong)bVar5 | 0x100000000;
    }
    else {
LAB_003b476f:
      uVar2 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar2);
      uVar8 = 0;
      if (uVar2 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar2 | uVar8;
    }
    uVar2 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
LAB_003b47ea:
      iVar6 = 7;
      if (((uVar2 & 7) != 4 && uVar2 != 0) &&
         (bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar2), iVar6 = 6,
         bVar1)) {
LAB_003b480f:
        iVar6 = 0;
      }
    }
    else {
      uVar3 = (uint)(uVar8 >> 3) & 0x1fffffff;
      if (uVar3 != 2) {
        if ((uVar3 != 1) || ((char)uVar8 != '\b')) goto LAB_003b47ea;
        pbVar4 = input->buffer_;
        if ((input->buffer_end_ <= pbVar4) ||
           (bVar5 = *pbVar4, puVar7 = &this->width_, (char)bVar5 < '\0')) {
          pVar9 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->width_ = pVar9.first;
          goto LAB_003b4827;
        }
LAB_003b47dc:
        *puVar7 = (ulong)bVar5;
        input->buffer_ = pbVar4 + 1;
        goto LAB_003b480f;
      }
      if ((char)uVar8 != '\x10') goto LAB_003b47ea;
      pbVar4 = input->buffer_;
      if ((pbVar4 < input->buffer_end_) &&
         (bVar5 = *pbVar4, puVar7 = &this->height_, -1 < (char)bVar5)) goto LAB_003b47dc;
      pVar9 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      this->height_ = pVar9.first;
LAB_003b4827:
      iVar6 = 6;
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_003b480f;
    }
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool ImageFeatureType_ImageSize::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ImageFeatureType.ImageSize)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 width = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &width_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 height = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ImageFeatureType.ImageSize)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ImageFeatureType.ImageSize)
  return false;
#undef DO_
}